

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMagCal.cpp
# Opt level: O3

bool __thiscall RTIMUMagCal::magCalSaveCorr(RTIMUMagCal *this,char *ellipsoidFitPath)

{
  RTIMUSettings *pRVar1;
  int iVar2;
  size_t sVar3;
  char *__s;
  RTIMUMagCal *this_00;
  float a [3];
  float b [9];
  RTVector3 local_3c;
  
  if (ellipsoidFitPath == (char *)0x0) {
    return false;
  }
  sVar3 = strlen(ellipsoidFitPath);
  __s = (char *)malloc(sVar3 + 0xd);
  sprintf(__s,"%s/%s",ellipsoidFitPath,"magCorr.dta");
  this_00 = (RTIMUMagCal *)fopen(__s,"r");
  if (this_00 == (RTIMUMagCal *)0x0) {
    magCalSaveCorr();
  }
  else {
    iVar2 = __isoc99_fscanf(this_00,"%f %f %f %f %f %f %f %f %f %f %f %f",a,a + 1,a + 2,b,b + 1,
                            b + 2,b + 3,b + 4,b + 5,b + 6,b + 7,b + 8);
    if (iVar2 == 0xc) {
      fclose((FILE *)this_00);
      this->m_settings->m_compassCalEllipsoidValid = true;
      RTVector3::RTVector3(&local_3c,a[0],a[1],a[2]);
      RTVector3::operator=(&this->m_settings->m_compassCalEllipsoidOffset,&local_3c);
      pRVar1 = this->m_settings;
      pRVar1->m_compassCalEllipsoidCorr[2][2] = b[8];
      pRVar1->m_compassCalEllipsoidCorr[1][1] = b[4];
      pRVar1->m_compassCalEllipsoidCorr[1][2] = b[5];
      pRVar1->m_compassCalEllipsoidCorr[2][0] = b[6];
      pRVar1->m_compassCalEllipsoidCorr[2][1] = b[7];
      pRVar1->m_compassCalEllipsoidCorr[0][0] = b[0];
      pRVar1->m_compassCalEllipsoidCorr[0][1] = b[1];
      pRVar1->m_compassCalEllipsoidCorr[0][2] = b[2];
      pRVar1->m_compassCalEllipsoidCorr[1][0] = b[3];
      (*(this->m_settings->super_RTIMUHal)._vptr_RTIMUHal[3])();
      return true;
    }
    magCalSaveCorr(this_00);
  }
  return false;
}

Assistant:

bool RTIMUMagCal::magCalSaveCorr(const char *ellipsoidFitPath)
{
    FILE *file;
    char *corrFile;
    float a[3];
    float b[9];

    if (ellipsoidFitPath != NULL) {
        corrFile = (char *)malloc(strlen(RTIMUCALDEFS_MAG_CORR_FILE) + strlen(ellipsoidFitPath) + 2);
        sprintf(corrFile, "%s/%s", ellipsoidFitPath, RTIMUCALDEFS_MAG_CORR_FILE);
        if ((file = fopen(corrFile, "r")) == NULL) {
            HAL_ERROR("Failed to open ellipsoid fit correction data file\n");
            return false;
        }
        if (fscanf(file, "%f %f %f %f %f %f %f %f %f %f %f %f",
            a + 0, a + 1, a + 2, b + 0, b + 1, b + 2, b + 3, b + 4, b + 5, b + 6, b + 7, b + 8) != 12) {
            HAL_ERROR("Ellipsoid corrcetion file didn't have 12 floats\n");
            fclose(file);
            return false;
        }
        fclose(file);
        m_settings->m_compassCalEllipsoidValid = true;
        m_settings->m_compassCalEllipsoidOffset = RTVector3(a[0], a[1], a[2]);
        memcpy(m_settings->m_compassCalEllipsoidCorr, b, 9 * sizeof(float));
        m_settings->saveSettings();
        return true;
    }
    return false;
}